

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_value.h
# Opt level: O0

void __thiscall
polyscope::PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
          (PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *this,string *name_,
          vec<3,_float,_(glm::qualifier)0> value_)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>,_true>
  this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  *this_01;
  mapped_type *pmVar2;
  string *in_RSI;
  string *in_RDI;
  undefined1 in_XMM0 [16];
  undefined4 in_XMM1_Da;
  key_type *in_stack_ffffffffffffff78;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>,_true>
  local_50 [3];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>,_true>
  local_38 [3];
  undefined8 local_20;
  undefined8 local_10;
  undefined4 local_8;
  
  local_20 = vmovlpd_avx(in_XMM0);
  local_10 = local_20;
  local_8 = in_XMM1_Da;
  std::__cxx11::string::string(in_RDI,in_RSI);
  *(undefined4 *)(in_RDI + 0x28) = local_8;
  *(undefined8 *)(in_RDI + 0x20) = local_10;
  detail::getPersistentCacheRef<glm::vec<3,float,(glm::qualifier)0>>();
  this_00._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
               *)in_stack_ffffffffffffff78,(key_type *)0x38c531);
  local_38[0]._M_cur = this_00._M_cur;
  detail::getPersistentCacheRef<glm::vec<3,float,(glm::qualifier)0>>();
  local_50[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
              *)in_stack_ffffffffffffff78);
  bVar1 = std::__detail::operator!=(local_38,local_50);
  if (bVar1) {
    this_01 = &detail::getPersistentCacheRef<glm::vec<3,float,(glm::qualifier)0>>()->cache;
    pmVar2 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
             ::operator[](this_01,in_stack_ffffffffffffff78);
    *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)pmVar2;
    *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(in_RDI + 0x28) =
         pmVar2->field_2;
  }
  else {
    manuallyChanged((PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_00._M_cur);
  }
  return;
}

Assistant:

PersistentValue(const std::string& name_, T value_) : name(name_), value(value_) {
    if (detail::getPersistentCacheRef<T>().cache.find(name) != detail::getPersistentCacheRef<T>().cache.end()) {
      value = detail::getPersistentCacheRef<T>().cache[name];
    } else {
      // Update cache value
      manuallyChanged();
    }
  }